

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enorm.c
# Opt level: O3

double enorm(int n,double *x)

{
  double dVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar3 = 0.0;
  dVar7 = 0.0;
  if (0 < n) {
    uVar2 = 0;
    dVar8 = 0.0;
    dVar3 = 0.0;
    dVar5 = 0.0;
    dVar4 = 0.0;
    do {
      dVar1 = x[uVar2];
      dVar6 = ABS(dVar1);
      if (1.34078079299426e+153 / (double)n <= dVar6) {
        if (dVar6 <= dVar8) {
          dVar4 = dVar4 + (dVar6 / dVar8) * (dVar6 / dVar8);
        }
        else {
          dVar4 = dVar4 * (dVar8 / dVar6) * (dVar8 / dVar6) + 1.0;
          dVar8 = dVar6;
        }
      }
      else if (dVar6 <= 1.82691291192569e-153) {
        if (dVar6 <= dVar7) {
          if ((dVar1 != 0.0) || (NAN(dVar1))) {
            dVar3 = dVar3 + (dVar6 / dVar7) * (dVar6 / dVar7);
          }
        }
        else {
          dVar3 = dVar3 * (dVar7 / dVar6) * (dVar7 / dVar6) + 1.0;
          dVar7 = dVar6;
        }
      }
      else {
        dVar5 = dVar5 + dVar1 * dVar1;
      }
      uVar2 = uVar2 + 1;
    } while ((uint)n != uVar2);
    if ((dVar4 != 0.0) || (NAN(dVar4))) {
      dVar4 = dVar4 + (dVar5 / dVar8) / dVar8;
      if (dVar4 < 0.0) {
        dVar4 = sqrt(dVar4);
      }
      else {
        dVar4 = SQRT(dVar4);
      }
      return dVar8 * dVar4;
    }
    if ((dVar5 != 0.0) || (NAN(dVar5))) {
      if (dVar7 <= dVar5) {
        dVar7 = ((dVar7 / dVar5) * dVar3 * dVar7 + 1.0) * dVar5;
        if (0.0 <= dVar7) {
          return SQRT(dVar7);
        }
      }
      else {
        dVar7 = (dVar3 * dVar7 + dVar5 / dVar7) * dVar7;
        if (0.0 <= dVar7) {
          return SQRT(dVar7);
        }
      }
      dVar7 = sqrt(dVar7);
      return dVar7;
    }
  }
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  return dVar7 * dVar3;
}

Assistant:

__cminpack_attr__
real __cminpack_func__(enorm)(int n, const real *x)
{
#ifdef USE_BLAS
    const __cminpack_blasint__ c__1 = 1;
    return __cminpack_blas__(nrm2)(&n, x, &c__1);
#else /* !USE_BLAS */
    /* System generated locals */
    real ret_val, d1;

    /* Local variables */
    int i;
    real s1, s2, s3, xabs, x1max, x3max, agiant;

/*     ********** */

/*     function enorm */

/*     given an n-vector x, this function calculates the */
/*     euclidean norm of x. */

/*     the euclidean norm is computed by accumulating the sum of */
/*     squares in three different sums. the sums of squares for the */
/*     small and large components are scaled so that no overflows */
/*     occur. non-destructive underflows are permitted. underflows */
/*     and overflows do not occur in the computation of the unscaled */
/*     sum of squares for the intermediate components. */
/*     the definitions of small, intermediate and large components */
/*     depend on two constants, rdwarf and rgiant. the main */
/*     restrictions on these constants are that rdwarf**2 not */
/*     underflow and rgiant**2 not overflow. the constants */
/*     given here are suitable for every known computer. */

/*     the function statement is */

/*       double precision function enorm(n,x) */

/*     where */

/*       n is a positive integer input variable. */

/*       x is an input array of length n. */

/*     subprograms called */

/*       fortran-supplied ... dabs,dsqrt */

/*     argonne national laboratory. minpack project. march 1980. */
/*     burton s. garbow, kenneth e. hillstrom, jorge j. more */

/*     ********** */

    s1 = 0.;
    s2 = 0.;
    s3 = 0.;
    x1max = 0.;
    x3max = 0.;
    agiant = rgiant / (real)n;
    for (i = 0; i < n; ++i) {
	xabs = fabs(x[i]);
        if (xabs >= agiant) {
/*              sum for large components. */
            if (xabs > x1max) {
                /* Computing 2nd power */
                d1 = x1max / xabs;
                s1 = 1 + s1 * (d1 * d1);
                x1max = xabs;
            } else {
                /* Computing 2nd power */
                d1 = xabs / x1max;
                s1 += d1 * d1;
            }
        } else if (xabs <= rdwarf) {
/*              sum for small components. */
            if (xabs > x3max) {
                /* Computing 2nd power */
                d1 = x3max / xabs;
                s3 = 1 + s3 * (d1 * d1);
                x3max = xabs;
            } else if (xabs != 0.) {
                /* Computing 2nd power */
                d1 = xabs / x3max;
                s3 += d1 * d1;
            }
	} else {
/*           sum for intermediate components. */
            /* Computing 2nd power */
            s2 += xabs * xabs;
        }
    }

/*     calculation of norm. */

    if (s1 != 0.) {
        ret_val = x1max * sqrt(s1 + (s2 / x1max) / x1max);
    } else if (s2 != 0.) {
        if (s2 >= x3max) {
            ret_val = sqrt(s2 * (1 + (x3max / s2) * (x3max * s3)));
        } else {
            ret_val = sqrt(x3max * ((s2 / x3max) + (x3max * s3)));
        }
    } else {
        ret_val = x3max * sqrt(s3);
    }
    return ret_val;

/*     last card of function enorm. */
#endif /* !USE_BLAS */
}